

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f906::ExternalFrameBufferTest_NoRelease_Test::TestBody
          (ExternalFrameBufferTest_NoRelease_Test *this)

{
  bool bVar1;
  aom_codec_err_t aVar2;
  AssertHelper *this_00;
  ExternalFrameBufferTest *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int num_buffers;
  AssertHelper *in_stack_ffffffffffffff40;
  aom_codec_err_t *in_stack_ffffffffffffff48;
  ExternalFrameBufferTest *in_stack_ffffffffffffff50;
  int line;
  char *in_stack_ffffffffffffff60;
  Type in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  AssertionResult local_88 [2];
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  aom_get_frame_buffer_cb_fn_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar4;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_20;
  undefined4 local_c;
  
  local_c = 0x10;
  ExternalFrameBufferTest::SetFrameBufferFunctions
            ((ExternalFrameBufferTest *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
             ,in_stack_ffffffffffffffa0,
             (aom_release_frame_buffer_cb_fn_t)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (aom_codec_err_t *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff50 =
         (ExternalFrameBufferTest *)
         testing::AssertionResult::failure_message((AssertionResult *)0x714a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x714abd);
  }
  uVar4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x714b3b);
  if (uVar4 == 0) {
    ExternalFrameBufferTest::DecodeOneFrame(in_stack_ffffffffffffff50);
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_RDI,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (aom_codec_err_t *)in_stack_ffffffffffffff40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffa0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff48 =
           (aom_codec_err_t *)testing::AssertionResult::failure_message((AssertionResult *)0x714bbf)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,(int)((ulong)in_RDI >> 0x20),
                 (char *)in_stack_ffffffffffffff50);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0x714c0d);
    }
    uVar4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x714c82);
    if (uVar4 == 0) {
      uVar3 = 2;
      aVar2 = ExternalFrameBufferTest::DecodeRemainingFrames(in_RDI);
      testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                ((char *)in_RDI,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (aom_codec_err_t *)in_stack_ffffffffffffff40);
      line = (int)((ulong)in_RDI >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
      if (!bVar1) {
        testing::Message::Message((Message *)CONCAT44(uVar3,aVar2));
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x714d03);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(uVar3,aVar2),in_stack_ffffffffffffff6c,
                   in_stack_ffffffffffffff60,line,(char *)in_stack_ffffffffffffff50);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x714d51);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x714dc3);
    }
  }
  return;
}

Assistant:

TEST_F(ExternalFrameBufferTest, NoRelease) {
  const int num_buffers = AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS;
  ASSERT_EQ(AOM_CODEC_OK,
            SetFrameBufferFunctions(num_buffers, get_aom_frame_buffer,
                                    do_not_release_aom_frame_buffer));
  ASSERT_EQ(AOM_CODEC_OK, DecodeOneFrame());
  ASSERT_EQ(AOM_CODEC_MEM_ERROR, DecodeRemainingFrames());
}